

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmpcfgs.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  SpecificStrategy *this;
  StrategyConfig config;
  _List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_e0;
  StrategyConfig local_c8;
  StrategyConfig local_78;
  
  local_e0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_e0;
  local_e0._M_impl._M_node._M_size = 0;
  local_e0._M_impl._M_node.super__List_node_base._M_prev =
       local_e0._M_impl._M_node.super__List_node_base._M_next;
  StrategyConfig::StrategyConfig
            (&local_c8,false,false,false,false,
             (list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              *)local_e0._M_impl._M_node.super__List_node_base._M_next,(char *)0x0,(char *)0x0,
             (char *)0x0,(char *)0x0,(char *)0x0);
  std::__cxx11::
  _List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_M_clear(&local_e0);
  readoptions(&local_78,argc,argv);
  StrategyConfig::operator=(&local_c8,&local_78);
  StrategyConfig::~StrategyConfig(&local_78);
  if (local_c8.specific == true) {
    this = (SpecificStrategy *)operator_new(0x268);
    SpecificStrategy::SpecificStrategy(this,&local_c8);
  }
  else {
    this = (SpecificStrategy *)operator_new(0x268);
    SimpleStrategy::SimpleStrategy((SimpleStrategy *)this,&local_c8);
  }
  (*(this->super_Strategy)._vptr_Strategy[2])(this);
  (*(this->super_Strategy)._vptr_Strategy[1])(this);
  StrategyConfig::~StrategyConfig(&local_c8);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
	StrategyConfig config;
	Strategy* strategy = 0;

	try {
		config = readoptions(argc, argv);
		if (config.specific)
			strategy = new SpecificStrategy(config);
		else
			strategy = new SimpleStrategy(config);

		strategy->process();
	} catch (const std::string& e) {
		std::cerr << e << std::endl;
	}

	if (strategy)
		delete strategy;

	return 0;
}